

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zetMetricGroupCreateExp
          (zet_device_handle_t hDevice,char *pName,char *pDescription,
          zet_metric_group_sampling_type_flags_t samplingType,
          zet_metric_group_handle_t *phMetricGroup)

{
  ze_result_t zVar1;
  
  if (DAT_0010d888 != (code *)0x0) {
    zVar1 = (*DAT_0010d888)();
    return zVar1;
  }
  context_t::get()::count = (zet_metric_group_handle_t)((long)context_t::get()::count + 1);
  *phMetricGroup = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupCreateExp(
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        const char* pName,                              ///< [in] pointer to metric group name. Must point to a null-terminated
                                                        ///< character array no longer than ::ZET_MAX_METRIC_GROUP_NAME.
        const char* pDescription,                       ///< [in] pointer to metric group description. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_GROUP_DESCRIPTION.
        zet_metric_group_sampling_type_flags_t samplingType,///< [in] Sampling type for the metric group.
        zet_metric_group_handle_t* phMetricGroup        ///< [in,out] Created Metric group handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateExp = context.zetDdiTable.MetricGroupExp.pfnCreateExp;
        if( nullptr != pfnCreateExp )
        {
            result = pfnCreateExp( hDevice, pName, pDescription, samplingType, phMetricGroup );
        }
        else
        {
            // generic implementation
            *phMetricGroup = reinterpret_cast<zet_metric_group_handle_t>( context.get() );

        }

        return result;
    }